

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O2

int getRewindTime(MidiFile *midifile,int track)

{
  bool bVar1;
  int index;
  int iVar2;
  MidiEventList *pMVar3;
  MidiEvent *pMVar4;
  int iVar5;
  
  index = smf::MidiFile::getEventCount(midifile,track);
  do {
    do {
      iVar5 = index;
      if (iVar5 < 1) {
        return -1;
      }
      index = iVar5 + -1;
      pMVar3 = smf::MidiFile::operator[](midifile,track);
      pMVar4 = smf::MidiEventList::operator[](pMVar3,index);
      bVar1 = smf::MidiMessage::isNoteOn(&pMVar4->super_MidiMessage);
    } while (!bVar1);
    pMVar3 = smf::MidiFile::operator[](midifile,track);
    pMVar4 = smf::MidiEventList::operator[](pMVar3,index);
    iVar2 = smf::MidiMessage::getKeyNumber(&pMVar4->super_MidiMessage);
  } while (iVar2 != RewindKey);
  pMVar3 = smf::MidiFile::operator[](midifile,track);
  pMVar4 = smf::MidiEventList::operator[](pMVar3,iVar5 + -1);
  return pMVar4->tick;
}

Assistant:

int getRewindTime(MidiFile& midifile, int track) {
	int count = midifile.getEventCount(track);
	for (int i=count-1; i>=0; i--) {
		if (!midifile[track][i].isNoteOn()) {
			continue;
		}
		if (midifile[track][i].getKeyNumber() == RewindKey) {
			return midifile[track][i].tick;
		}
	}

	return -1;
}